

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::aggregate_formatter::format
          (aggregate_formatter *this,log_msg *param_2,tm *param_3,memory_buf_t *dest)

{
  string_view_t view;
  memory_buf_t *in_RCX;
  char *in_RDX;
  size_t in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string_view<char> *in_stack_ffffffffffffffd0;
  
  ::fmt::v6::basic_string_view<char>::basic_string_view<std::char_traits<char>,std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  view.size_ = in_RSI;
  view.data_ = in_RDX;
  fmt_helper::append_string_view(view,in_RCX);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override
    {
        fmt_helper::append_string_view(str_, dest);
    }